

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreePrevious(BtCursor *pCur)

{
  char cVar1;
  uint uVar2;
  MemPage *pMVar3;
  ushort uVar4;
  int iVar5;
  long lVar6;
  undefined8 in_RSI;
  
  if (pCur->eState != 1) {
    iVar5 = 0;
    if (2 < pCur->eState) {
      iVar5 = btreeRestoreCursorPosition(pCur);
    }
    if (iVar5 != 0) {
      return iVar5;
    }
    if (pCur->eState == '\0') {
      return 0x65;
    }
    iVar5 = pCur->skipNext;
    if (iVar5 != 0) {
      pCur->eState = '\x01';
      pCur->skipNext = 0;
      if (iVar5 < 0) {
        return 0;
      }
    }
  }
  pMVar3 = pCur->apPage[pCur->iPage];
  uVar4 = pCur->ix;
  if (pMVar3->leaf == '\0') {
    uVar2 = *(uint *)(pMVar3->aData +
                     (CONCAT11(pMVar3->aCellIdx[(ulong)uVar4 * 2],
                               pMVar3->aCellIdx[(ulong)uVar4 * 2 + 1]) & pMVar3->maskPage));
    iVar5 = moveToChild(pCur,uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18);
    if (iVar5 == 0) {
      iVar5 = moveToRightmost(pCur);
      return iVar5;
    }
  }
  else {
    while (uVar4 == 0) {
      cVar1 = pCur->iPage;
      lVar6 = (long)cVar1;
      if (lVar6 == 0) {
        pCur->eState = '\0';
        return 0x65;
      }
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf9;
      pCur->ix = pCur->aiIdx[lVar6 + -1];
      pCur->iPage = cVar1 + -1;
      sqlite3PagerUnrefNotNull(pCur->apPage[lVar6]->pDbPage);
      uVar4 = pCur->ix;
    }
    pCur->ix = uVar4 - 1;
    iVar5 = 0;
    if ((pCur->apPage[pCur->iPage]->intKey != '\0') && (pCur->apPage[pCur->iPage]->leaf == '\0')) {
      iVar5 = sqlite3BtreePrevious(pCur,(int)in_RSI);
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

static SQLITE_NOINLINE int btreePrevious(BtCursor *pCur){
  int rc;
  MemPage *pPage;

  assert( cursorOwnsBtShared(pCur) );
  assert( pCur->skipNext==0 || pCur->eState!=CURSOR_VALID );
  assert( (pCur->curFlags & (BTCF_AtLast|BTCF_ValidOvfl|BTCF_ValidNKey))==0 );
  assert( pCur->info.nSize==0 );
  if( pCur->eState!=CURSOR_VALID ){
    rc = restoreCursorPosition(pCur);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( CURSOR_INVALID==pCur->eState ){
      return SQLITE_DONE;
    }
    if( pCur->skipNext ){
      assert( pCur->eState==CURSOR_VALID || pCur->eState==CURSOR_SKIPNEXT );
      pCur->eState = CURSOR_VALID;
      if( pCur->skipNext<0 ){
        pCur->skipNext = 0;
        return SQLITE_OK;
      }
      pCur->skipNext = 0;
    }
  }

  pPage = pCur->apPage[pCur->iPage];
  assert( pPage->isInit );
  if( !pPage->leaf ){
    int idx = pCur->ix;
    rc = moveToChild(pCur, get4byte(findCell(pPage, idx)));
    if( rc ) return rc;
    rc = moveToRightmost(pCur);
  }else{
    while( pCur->ix==0 ){
      if( pCur->iPage==0 ){
        pCur->eState = CURSOR_INVALID;
        return SQLITE_DONE;
      }
      moveToParent(pCur);
    }
    assert( pCur->info.nSize==0 );
    assert( (pCur->curFlags & (BTCF_ValidOvfl))==0 );

    pCur->ix--;
    pPage = pCur->apPage[pCur->iPage];
    if( pPage->intKey && !pPage->leaf ){
      rc = sqlite3BtreePrevious(pCur, 0);
    }else{
      rc = SQLITE_OK;
    }
  }
  return rc;
}